

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::WriteTextCommandWithEncoding
          (AbstractContentContext *this,string *inUnicodeText,ITextCommand *inTextCommand)

{
  EStatusCode EVar1;
  GlyphUnicodeMappingList glyphsAndUnicode;
  _List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> local_28;
  
  local_28._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_28;
  local_28._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_28;
  local_28._M_impl._M_node._M_size = 0;
  EncodeWithCurrentFont(this,inUnicodeText,(GlyphUnicodeMappingList *)&local_28);
  EVar1 = WriteTextCommandWithDirectGlyphSelection
                    (this,(GlyphUnicodeMappingList *)&local_28,inTextCommand);
  std::__cxx11::_List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::_M_clear
            (&local_28);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::WriteTextCommandWithEncoding(const std::string& inUnicodeText,ITextCommand* inTextCommand)
{
	GlyphUnicodeMappingList glyphsAndUnicode;
	EncodeWithCurrentFont(inUnicodeText, glyphsAndUnicode);

	return WriteTextCommandWithDirectGlyphSelection(glyphsAndUnicode,inTextCommand);
}